

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc-parse.c
# Opt level: O0

void ZCCParse(void *yyp,int yymajor,ZCCToken yyminor,ZCCParseState *stat)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  ZCCToken yyminor_00;
  ZCCToken yyMinor;
  ZCCToken yyMinor_00;
  char local_a7;
  int local_a4;
  int i;
  int yymx;
  yyParser_conflict *yypParser;
  int yyerrorhit;
  uint yyact;
  YYMINORTYPE_conflict yyminorunion;
  ZCCParseState *stat_local;
  void *pvStack_20;
  int yymajor_local;
  void *yyp_local;
  ZCCToken yyminor_local;
  
  yyp_local = (void *)yyminor.field_0;
  yyminor_local.field_0.Int = yyminor.SourceLoc;
  bVar2 = false;
  yyminorunion._32_8_ = stat;
  stat_local._4_4_ = yymajor;
  pvStack_20 = yyp;
  if (*yyp < 0) {
    *(undefined4 *)yyp = 0;
    *(undefined4 *)((long)yyp + 4) = 0xffffffff;
    *(undefined2 *)((long)yyp + 0x10) = 0;
    *(undefined1 *)((long)yyp + 0x12) = 0;
    if (yyTraceFILE != (FILE *)0x0) {
      fprintf((FILE *)yyTraceFILE,"%sInitialize. Empty stack. State 0\n",yyTracePrompt);
    }
  }
  *(undefined8 *)((long)yyp + 8) = yyminorunion._32_8_;
  if (yyTraceFILE != (FILE *)0x0) {
    fprintf((FILE *)yyTraceFILE,"%sInput \'%s\'\n",yyTracePrompt,yyTokenName[stat_local._4_4_]);
  }
  do {
    yypParser._4_4_ = yy_find_shift_action((yyParser_conflict *)yyp,(uchar)stat_local._4_4_);
    if (yypParser._4_4_ < 0x2cd) {
      if (0xf4 < yypParser._4_4_) {
        yypParser._4_4_ = yypParser._4_4_ + 0x113;
      }
      yyMinor.SourceLoc = yyminor_local.field_0.Int;
      yyMinor.field_0.String = (FString *)yyp_local;
      yyMinor._12_4_ = 0;
      yy_shift((yyParser_conflict *)yyp,yypParser._4_4_,stat_local._4_4_,yyMinor);
      *(int *)((long)yyp + 4) = *(int *)((long)yyp + 4) + -1;
      stat_local._4_4_ = 0xda;
    }
    else if (yypParser._4_4_ < 0x3e0) {
      yy_reduce((yyParser_conflict *)yyp,yypParser._4_4_ - 0x2cd);
    }
    else {
      if (yypParser._4_4_ != 0x3e0) {
        __assert_fail("yyact == YY_ERROR_ACTION",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/build_O0/src/zcc-parse.c"
                      ,0x1165,"void ZCCParse(void *, int, ZCCToken, ZCCParseState *)");
      }
      _yyerrorhit = yyp_local;
      yyminorunion._4_4_ = yyminor_local.field_0._4_4_;
      yyminorunion._0_4_ = yyminor_local.field_0.Int;
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
      }
      if (*(int *)((long)yyp + 4) < 0) {
        yyminor_00.SourceLoc = yyminor_local.field_0.Int;
        yyminor_00.field_0.String = (FString *)yyp_local;
        yyminor_00._12_4_ = 0;
        yy_syntax_error((yyParser_conflict *)yyp,stat_local._4_4_,yyminor_00);
      }
      cVar1 = *(char *)((long)yyp + (long)*yyp * 0x30 + 0x12);
      if ((cVar1 == -0x80) || (bVar2)) {
        if (yyTraceFILE != (FILE *)0x0) {
          fprintf((FILE *)yyTraceFILE,"%sDiscard input token %s\n",yyTracePrompt,
                  yyTokenName[stat_local._4_4_]);
        }
        yy_destructor((yyParser_conflict *)yyp,(uchar)stat_local._4_4_,
                      (YYMINORTYPE_conflict *)&yyerrorhit);
        stat_local._4_4_ = 0xda;
      }
      else {
        yypParser._4_4_ = 0x3e0;
        while( true ) {
          bVar2 = false;
          if ((-1 < *yyp) && (bVar2 = false, cVar1 != -0x80)) {
            yypParser._4_4_ =
                 yy_find_reduce_action((uint)*(ushort *)((long)yyp + (long)*yyp * 0x30 + 0x10),0x80)
            ;
            bVar2 = 0x2cc < yypParser._4_4_;
          }
          if (!bVar2) break;
          yy_pop_parser_stack((yyParser_conflict *)yyp);
        }
        if ((*yyp < 0) || (stat_local._4_4_ == 0)) {
          yy_destructor((yyParser_conflict *)yyp,(uchar)stat_local._4_4_,
                        (YYMINORTYPE_conflict *)&yyerrorhit);
          yy_parse_failed((yyParser_conflict *)yyp);
          stat_local._4_4_ = 0xda;
        }
        else if (cVar1 != -0x80) {
          yyMinor_00.SourceLoc = yyminor_local.field_0.Int;
          yyMinor_00.field_0.String = (FString *)yyp_local;
          yyMinor_00._12_4_ = 0;
          yy_shift((yyParser_conflict *)yyp,yypParser._4_4_,0x80,yyMinor_00);
        }
      }
      *(undefined4 *)((long)yyp + 4) = 3;
      bVar2 = true;
    }
    bVar3 = false;
    if (stat_local._4_4_ != 0xda) {
      bVar3 = -1 < *yyp;
    }
  } while (bVar3);
  if (yyTraceFILE != (FILE *)0x0) {
    fprintf((FILE *)yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
    for (local_a4 = 1; local_a4 <= *yyp; local_a4 = local_a4 + 1) {
      local_a7 = '[';
      if (local_a4 != 1) {
        local_a7 = ' ';
      }
      fprintf((FILE *)yyTraceFILE,"%c%s",(ulong)(uint)(int)local_a7,
              yyTokenName[*(byte *)((long)yyp + (long)local_a4 * 0x30 + 0x12)]);
    }
    fprintf((FILE *)yyTraceFILE,"]\n");
  }
  return;
}

Assistant:

void ZCCParse(
  void *yyp,                   /* The parser */
  int yymajor,                 /* The major token code number */
  ZCCParseTOKENTYPE yyminor       /* The value for the token */
  ZCCParseARG_PDECL               /* Optional %extra_argument parameter */
){
  YYMINORTYPE yyminorunion;
  unsigned int yyact;   /* The parser action. */
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  int yyendofinput;     /* True if we are at the end of input */
#endif
#ifdef YYERRORSYMBOL
  int yyerrorhit = 0;   /* True if yymajor has invoked an error */
#endif
  yyParser *yypParser;  /* The parser */

  /* (re)initialize the parser, if necessary */
  yypParser = (yyParser*)yyp;
  if( yypParser->yyidx<0 ){
#if YYSTACKDEPTH<=0
    if( yypParser->yystksz <=0 ){
      yyStackOverflow(yypParser);
      return;
    }
#endif
    yypParser->yyidx = 0;
#ifndef YYNOERRORRECOVERY
    yypParser->yyerrcnt = -1;
#endif
    yypParser->yystack[0].stateno = 0;
    yypParser->yystack[0].major = 0;
#ifndef NDEBUG
    if( yyTraceFILE ){
      fprintf(yyTraceFILE,"%sInitialize. Empty stack. State 0\n",
              yyTracePrompt);
    }
#endif
  }
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  yyendofinput = (yymajor==0);
#endif
  ZCCParseARG_STORE;

#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sInput '%s'\n",yyTracePrompt,yyTokenName[yymajor]);
  }
#endif

  do{
    yyact = yy_find_shift_action(yypParser,(YYCODETYPE)yymajor);
    if( yyact <= YY_MAX_SHIFTREDUCE ){
      if( yyact > YY_MAX_SHIFT ) yyact += YY_MIN_REDUCE - YY_MIN_SHIFTREDUCE;
      yy_shift(yypParser,yyact,yymajor,yyminor);
#ifndef YYNOERRORRECOVERY
      yypParser->yyerrcnt--;
#endif
      yymajor = YYNOCODE;
    }else if( yyact <= YY_MAX_REDUCE ){
      yy_reduce(yypParser,yyact-YY_MIN_REDUCE);
    }else{
#ifdef YYERRORSYMBOL
      int yymx;
#endif
      assert( yyact == YY_ERROR_ACTION );
      yyminorunion.yy0 = yyminor;
#ifndef NDEBUG
      if( yyTraceFILE ){
        fprintf(yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
      }
#endif
#ifdef YYERRORSYMBOL
      /* A syntax error has occurred.
      ** The response to an error depends upon whether or not the
      ** grammar defines an error token "ERROR".
      **
      ** This is what we do if the grammar does define ERROR:
      **
      **  * Call the %syntax_error function.
      **
      **  * Begin popping the stack until we enter a state where
      **    it is legal to shift the error symbol, then shift
      **    the error symbol.
      **
      **  * Set the error count to three.
      **
      **  * Begin accepting and shifting new tokens.  No new error
      **    processing will occur until three tokens have been
      **    shifted successfully.
      **
      */
      if( yypParser->yyerrcnt<0 ){
        yy_syntax_error(yypParser,yymajor,yyminor);
      }
      yymx = yypParser->yystack[yypParser->yyidx].major;
      if( yymx==YYERRORSYMBOL || yyerrorhit ){
#ifndef NDEBUG
        if( yyTraceFILE ){
          fprintf(yyTraceFILE,"%sDiscard input token %s\n",
             yyTracePrompt,yyTokenName[yymajor]);
        }
#endif
        yy_destructor(yypParser, (YYCODETYPE)yymajor, &yyminorunion);
        yymajor = YYNOCODE;
      }else{
        while(
          yypParser->yyidx >= 0 &&
          yymx != YYERRORSYMBOL &&
          (yyact = yy_find_reduce_action(
                        yypParser->yystack[yypParser->yyidx].stateno,
                        YYERRORSYMBOL)) >= YY_MIN_REDUCE
        ){
          yy_pop_parser_stack(yypParser);
        }
        if( yypParser->yyidx < 0 || yymajor==0 ){
          yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
          yy_parse_failed(yypParser);
          yymajor = YYNOCODE;
        }else if( yymx!=YYERRORSYMBOL ){
          yy_shift(yypParser,yyact,YYERRORSYMBOL,yyminor);
        }
      }
      yypParser->yyerrcnt = 3;
      yyerrorhit = 1;
#elif defined(YYNOERRORRECOVERY)
      /* If the YYNOERRORRECOVERY macro is defined, then do not attempt to
      ** do any kind of error recovery.  Instead, simply invoke the syntax
      ** error routine and continue going as if nothing had happened.
      **
      ** Applications can set this macro (for example inside %include) if
      ** they intend to abandon the parse upon the first syntax error seen.
      */
      yy_syntax_error(yypParser,yymajor, yyminor);
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      yymajor = YYNOCODE;

#else  /* YYERRORSYMBOL is not defined */
      /* This is what we do if the grammar does not define ERROR:
      **
      **  * Report an error message, and throw away the input token.
      **
      **  * If the input token is $, then fail the parse.
      **
      ** As before, subsequent error messages are suppressed until
      ** three input tokens have been successfully shifted.
      */
      if( yypParser->yyerrcnt<=0 ){
        yy_syntax_error(yypParser,yymajor, yyminor);
      }
      yypParser->yyerrcnt = 3;
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      if( yyendofinput ){
        yy_parse_failed(yypParser);
      }
      yymajor = YYNOCODE;
#endif
    }
  }while( yymajor!=YYNOCODE && yypParser->yyidx>=0 );
#ifndef NDEBUG
  if( yyTraceFILE ){
    int i;
    fprintf(yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
    for(i=1; i<=yypParser->yyidx; i++)
      fprintf(yyTraceFILE,"%c%s", i==1 ? '[' : ' ', 
              yyTokenName[yypParser->yystack[i].major]);
    fprintf(yyTraceFILE,"]\n");
  }
#endif
  return;
}